

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.hpp
# Opt level: O2

void __thiscall cpprofiler::Connector::restart(Connector *this,int restart_id)

{
  ostream *poVar1;
  string info;
  stringstream ss;
  string sStack_1e8;
  string local_1c8 [32];
  allocator local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::string::string((string *)&sStack_1e8,"",local_1a8);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::operator<<(local_198,"{");
  poVar1 = std::operator<<(local_198,"\"restart_id\": ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,restart_id);
  std::operator<<(poVar1,"\n");
  std::operator<<(local_198,"}");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&sStack_1e8,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  MessageMarshalling::makeRestart(&this->marshalling,&sStack_1e8);
  sendOverSocket(this);
  std::__cxx11::string::~string((string *)&sStack_1e8);
  return;
}

Assistant:

void restart(int restart_id = -1) {

    std::string info{""};
    {
      std::stringstream ss;
      ss << "{";
      ss << "\"restart_id\": " << restart_id << "\n";
      ss << "}";
      info = ss.str();
    }

    marshalling.makeRestart(info);
    sendOverSocket();
  }